

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

void duckdb::FSSTStorage::Select
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  optional_ptr<duckdb::FileBuffer,_true> *this;
  data_ptr_t pdVar1;
  idx_t iVar2;
  ulong uVar3;
  FSSTScanState *scan_state;
  VectorStringBuffer *str_buffer;
  long lVar4;
  ulong compressed_string_len;
  ulong uVar5;
  data_ptr_t compressed_string;
  idx_t start;
  ulong uVar6;
  data_ptr_t pdVar7;
  anon_union_16_2_67f50693_for_value aVar8;
  bp_delta_offsets_t offsets;
  bp_delta_offsets_t local_68;
  
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  this = &(scan_state->super_StringScanState).handle.node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  pdVar1 = ((scan_state->super_StringScanState).handle.node.ptr)->buffer;
  iVar2 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  uVar3 = *(ulong *)(((scan_state->super_StringScanState).handle.node.ptr)->buffer + segment->offset
                    );
  str_buffer = StringVector::GetStringBuffer(result);
  StartScan(&local_68,scan_state,pdVar1 + iVar2 + 0x10,start,vector_count);
  if (sel_count != 0) {
    pdVar7 = result->data + 8;
    uVar6 = 0;
    do {
      uVar5 = uVar6;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar6];
      }
      compressed_string_len =
           (ulong)(scan_state->bitunpack_buffer).
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                  [local_68.scan_offset + uVar5];
      lVar4 = (long)(int)(scan_state->delta_decode_buffer).
                         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t
                         .super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                         .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                         [local_68.unused_delta_decoded_values + uVar5];
      compressed_string = pdVar1 + (((uVar3 >> 0x20) + iVar2) - lVar4);
      if (lVar4 == 0) {
        compressed_string = (data_ptr_t)0x0;
      }
      if (compressed_string_len == 0) {
        uVar5 = 0;
        aVar8 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
      }
      else {
        if (scan_state->all_values_inlined == true) {
          aVar8.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               FSSTPrimitives::DecompressInlinedValue
                         (scan_state->duckdb_fsst_decoder_ptr,(char *)compressed_string,
                          compressed_string_len);
        }
        else {
          aVar8.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               FSSTPrimitives::DecompressValue
                         (scan_state->duckdb_fsst_decoder_ptr,str_buffer,(char *)compressed_string,
                          compressed_string_len);
        }
        uVar5 = aVar8._0_8_ & 0xffffffff00000000;
      }
      *(ulong *)(pdVar7 + -8) = aVar8.pointer.length | uVar5;
      *(char **)pdVar7 = aVar8.pointer.ptr;
      uVar6 = uVar6 + 1;
      pdVar7 = pdVar7 + 0x10;
    } while (sel_count != uVar6);
  }
  scan_state->last_known_index =
       (scan_state->delta_decode_buffer).
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
       [local_68.unused_delta_decoded_values + vector_count + 0xffffffffffffffff];
  scan_state->last_known_row = vector_count + start + -1;
  return;
}

Assistant:

void FSSTStorage::Select(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
                         const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);

	auto &str_buffer = StringVector::GetStringBuffer(result);
	auto offsets = StartScan(scan_state, base_data, start, vector_count);
	auto result_data = FlatVector::GetData<string_t>(result);

	for (idx_t i = 0; i < sel_count; i++) {
		idx_t index = sel.get_index(i);
		result_data[i] = scan_state.DecompressString(dict, baseptr, offsets, index, str_buffer);
	}
	EndScan(scan_state, offsets, start, vector_count);
}